

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O3

void __thiscall
license::EventRegistry::addEvent(EventRegistry *this,EVENT_TYPE event,SEVERITY severity)

{
  pointer *ppAVar1;
  iterator __position;
  AuditEvent audit;
  AuditEvent local_210;
  
  local_210.param1[0] = '\0';
  local_210.param2[0] = '\0';
  __position._M_current =
       (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_210.severity = severity;
  local_210.event_type = event;
  if (__position._M_current ==
      (this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<AuditEvent,std::allocator<AuditEvent>>::_M_realloc_insert<AuditEvent_const&>
              ((vector<AuditEvent,std::allocator<AuditEvent>> *)this,__position,&local_210);
  }
  else {
    memcpy(__position._M_current,&local_210,0x208);
    ppAVar1 = &(this->logs).super__Vector_base<AuditEvent,_std::allocator<AuditEvent>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
  return;
}

Assistant:

void EventRegistry::addEvent(EVENT_TYPE event, SEVERITY severity) {
	AuditEvent audit;
	audit.severity = severity;
	audit.event_type = event;
	audit.param1[0] = '\0';
	audit.param2[0] = '\0';
	logs.push_back(audit);
}